

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_draw.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  ALLEGRO_COLOR AVar2;
  ALLEGRO_BITMAP *pAVar3;
  char cVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  long *plVar12;
  long lVar13;
  undefined8 uVar14;
  ALLEGRO_EVENT_QUEUE *pAVar15;
  undefined8 uVar16;
  char *in_RCX;
  float *pfVar17;
  long unaff_RBX;
  code *pcVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  undefined4 in_XMM1_Da;
  float fVar22;
  float fVar23;
  float in_XMM1_Db;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  ALLEGRO_COLOR color;
  int cx;
  int ch;
  int cw;
  int cy;
  uchar g;
  uchar r;
  char str [256];
  undefined8 uStack_bf0;
  float *pfStack_be8;
  undefined1 *puStack_be0;
  undefined1 auStack_bd0 [8];
  code *pcStack_bc8;
  char *pcStack_bb8;
  char acStack_b20 [1032];
  undefined1 auStack_718 [1024];
  long lStack_318;
  float local_2f0;
  undefined1 local_2ec [4];
  float local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  undefined8 local_2d8;
  float local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  undefined8 local_2b8;
  ALLEGRO_BITMAP *local_2a8;
  long local_2a0;
  ulong local_298;
  undefined1 local_28c [4];
  undefined1 local_288 [4];
  undefined1 local_284 [4];
  int local_280 [8];
  int local_260;
  float afStack_244 [3];
  float local_238 [64];
  char local_138 [264];
  
  pcVar18 = atexit;
  cVar4 = al_install_system(0x5020700);
  if (cVar4 == '\0') {
    pcVar10 = "Could not init Allegro.\n";
  }
  else {
    al_init_primitives_addon();
    al_install_keyboard();
    al_install_mouse();
    al_init_image_addon();
    al_init_font_addon();
    ex.samples = 0;
    unaff_RBX = al_load_config_file("ex_draw.ini");
    if (unaff_RBX == 0) {
      unaff_RBX = al_create_config();
    }
    pcVar10 = (char *)al_get_config_value(unaff_RBX,"settings","samples");
    if (pcVar10 == (char *)0x0) {
      uVar11 = (ulong)(uint)ex.samples;
    }
    else {
      uVar11 = strtol(pcVar10,(char **)0x0,0);
      ex.samples = (int)uVar11;
    }
    in_RCX = local_138;
    sprintf(in_RCX,"%d",uVar11);
    al_set_config_value(unaff_RBX,"settings","samples");
    al_save_config_file("ex_draw.ini",unaff_RBX);
    al_destroy_config(unaff_RBX);
    if (ex.samples != 0) {
      al_set_new_display_option(0x11,1,1);
      al_set_new_display_option(0x12,ex.samples,2);
    }
    pcVar18 = (code *)0x280;
    local_2a0 = al_create_display(0x280);
    if (local_2a0 == 0) {
      pcVar10 = "Unable to create display.\n";
    }
    else {
      ex.FPS = 0x3c;
      pcVar18 = (code *)0x0;
      ex.font = (ALLEGRO_FONT *)al_load_font("data/fixed_font.tga",0,0);
      if (ex.font != (ALLEGRO_FONT *)0x0) {
        uVar14 = al_color_name("beige");
        ex.background.b = (float)in_XMM1_Da;
        ex.background.r = (float)(int)uVar14;
        ex.background.g = (float)(int)((ulong)uVar14 >> 0x20);
        ex.background.a = in_XMM1_Db;
        uVar14 = al_color_name("black");
        ex.foreground.b = (float)in_XMM1_Da;
        ex.foreground.r = (float)(int)uVar14;
        ex.foreground.g = (float)(int)((ulong)uVar14 >> 0x20);
        ex.foreground.a = in_XMM1_Db;
        uVar14 = al_color_name("red");
        ex.outline.b = (float)in_XMM1_Da;
        ex.outline.r = (float)(int)uVar14;
        ex.outline.g = (float)(int)((ulong)uVar14 >> 0x20);
        ex.outline.a = in_XMM1_Db;
        uVar14 = al_color_name("blue");
        ex.text.b = (float)in_XMM1_Da;
        ex.text.r = (float)(int)uVar14;
        ex.text.g = (float)(int)((ulong)uVar14 >> 0x20);
        ex.text.a = in_XMM1_Db;
        uVar14 = al_color_name("white");
        ex.white.b = (float)in_XMM1_Da;
        ex.white.r = (float)(int)uVar14;
        ex.white.g = (float)(int)((ulong)uVar14 >> 0x20);
        ex.white.a = in_XMM1_Db;
        ex.pattern = (ALLEGRO_BITMAP *)al_create_bitmap(0x20,0x20);
        ex.zoom = (ALLEGRO_BITMAP *)al_create_bitmap(0x20,0x20);
        pAVar3 = ex.pattern;
        local_2f0 = (float)al_get_bitmap_width(ex.pattern);
        uVar6 = al_get_bitmap_height(pAVar3);
        fVar22 = 1.0;
        uVar24 = 0;
        uVar26 = 0;
        uVar28 = 0;
        local_2b8 = al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
        fVar23 = 0.9;
        uVar25 = 0;
        uVar27 = 0;
        uVar29 = 0;
        local_2c8 = fVar22;
        uStack_2c4 = uVar24;
        uStack_2c0 = uVar26;
        uStack_2bc = uVar28;
        local_2d8 = al_map_rgb_f(0x3f800000,0x3f666666,0x3f4ccccd);
        local_2a8 = pAVar3;
        local_2e8 = fVar23;
        uStack_2e4 = uVar25;
        uStack_2e0 = uVar27;
        uStack_2dc = uVar29;
        plVar12 = (long *)al_lock_bitmap(pAVar3,0x13,2);
        if (0 < (int)uVar6) {
          uVar11 = (ulong)(uint)local_2f0;
          uVar19 = 0;
          local_298 = (ulong)uVar6;
          do {
            if (0 < (int)local_2f0) {
              lVar20 = 0;
              uVar21 = uVar19;
              uVar14 = local_2d8;
              do {
                local_2d8._0_4_ = (float)uVar14;
                fVar22 = local_2e8;
                if ((uVar21 & 1) != 0) {
                  local_2d8._0_4_ = (float)(undefined4)local_2b8;
                  fVar22 = local_2c8;
                }
                lVar13 = *plVar12;
                al_unmap_rgb((float)local_2d8,fVar22,local_238,local_280,local_2ec);
                local_2d8 = uVar14;
                lVar13 = *(int *)((long)plVar12 + 0xc) * (int)uVar19 + lVar13;
                *(undefined1 *)(lVar20 + lVar13) = local_238[0]._0_1_;
                *(undefined1 *)(lVar20 + 1 + lVar13) = (undefined1)local_280[0];
                *(undefined1 *)(lVar20 + 2 + lVar13) = local_2ec[0];
                lVar20 = lVar20 + 3;
                uVar21 = uVar21 + 1;
                uVar14 = local_2d8;
              } while (uVar11 * 3 != lVar20);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != local_298);
        }
        al_unlock_bitmap(local_2a8);
        uVar14 = al_create_timer(SUB84(1.0 / (double)ex.FPS,0));
        pAVar15 = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
        ex.queue = pAVar15;
        uVar16 = al_get_keyboard_event_source();
        al_register_event_source(pAVar15,uVar16);
        pAVar15 = ex.queue;
        uVar16 = al_get_mouse_event_source();
        al_register_event_source(pAVar15,uVar16);
        pAVar15 = ex.queue;
        uVar16 = al_get_display_event_source(local_2a0);
        al_register_event_source(pAVar15,uVar16);
        pAVar15 = ex.queue;
        uVar16 = al_get_timer_event_source(uVar14);
        al_register_event_source(pAVar15,uVar16);
        al_start_timer(uVar14);
        do {
          bVar5 = al_is_event_queue_empty(ex.queue);
          if (bVar5 != 0) {
            iVar7 = al_get_bitmap_width(ex.zoom);
            iVar8 = al_get_bitmap_height(ex.zoom);
            uVar14 = al_get_target_bitmap();
            iVar9 = 0;
            pfVar17 = local_238;
            lVar20 = 0;
            do {
              fVar22 = (float)iVar9 + (float)(int)lVar20 * 0.25 + 2.0;
              fVar23 = fVar22 + 5.0;
              pfVar17[0xc] = 23.75;
              pfVar17[0xd] = fVar22;
              pfVar17[0xe] = 28.75;
              pfVar17[0xf] = fVar23;
              pfVar17[8] = 16.5;
              pfVar17[9] = fVar22;
              pfVar17[10] = 21.5;
              pfVar17[0xb] = fVar23;
              pfVar17[4] = 9.25;
              pfVar17[5] = fVar22;
              pfVar17[6] = 14.25;
              pfVar17[7] = fVar23;
              *pfVar17 = 2.0;
              pfVar17[1] = fVar22;
              pfVar17[2] = 7.0;
              pfVar17[3] = fVar23;
              lVar20 = lVar20 + 1;
              iVar9 = iVar9 + 7;
              pfVar17 = pfVar17 + 0x10;
            } while (lVar20 != 4);
            al_get_clipping_rectangle(local_2ec,local_284,local_288,local_28c);
            al_clear_to_color(ex.background.r);
            ex.text_x = 8.0;
            ex.text_y = 0.0;
            print("Drawing %s (press SPACE to change)",names[ex.what]);
            ex.text_x = 8.0;
            ex.text_y = 16.0;
            print("Original");
            ex.text_x = 80.0;
            ex.text_y = 16.0;
            print("Enlarged x 16");
            al_set_blender(0,1,0);
            local_2b8 = uVar14;
            if (ex.software == true) {
              al_set_new_bitmap_flags(1);
              uVar14 = al_get_target_bitmap();
              uVar24 = al_get_bitmap_format(uVar14);
              al_set_new_bitmap_format(uVar24);
              uVar14 = al_create_bitmap(iVar7,iVar8);
              al_set_target_bitmap(uVar14);
              local_2d8._0_4_ = 0.0;
              local_2e8 = 0.0;
            }
            else {
              uVar14 = 0;
              local_2d8._0_4_ = 40.0;
              local_2e8 = 8.0;
            }
            al_draw_bitmap(ex.pattern,0);
            al_set_blender(0,1,3);
            lVar20 = 0xc;
            do {
              AVar2 = ex.foreground;
              color.a = ex.foreground.a * 0.5;
              color.b = ex.foreground.b;
              color.r = ex.foreground.r;
              color.g = ex.foreground.g;
              ex.foreground = AVar2;
              primitive(*(float *)((long)afStack_244 + lVar20) + local_2e8,
                        *(float *)((long)afStack_244 + lVar20 + 4) + (float)local_2d8,
                        *(float *)((long)afStack_244 + lVar20 + 8) + local_2e8,
                        *(float *)((long)local_238 + lVar20) + (float)local_2d8,color,false);
              lVar20 = lVar20 + 0x10;
            } while (lVar20 != 0x10c);
            al_set_blender(0,1,0);
            uVar16 = local_2b8;
            if (ex.software == true) {
              al_set_target_bitmap(local_2b8);
              al_draw_bitmap(0x41000000,0x42200000,uVar14,0);
              al_destroy_bitmap(uVar14);
              local_2d8._0_4_ = 40.0;
              local_2e8 = 8.0;
            }
            al_set_target_bitmap(ex.zoom);
            local_2c8 = (float)iVar7;
            local_2f0 = (float)iVar8;
            al_draw_bitmap_region(local_2e8,(float)local_2d8,local_2c8,local_2f0,0,0,uVar16,0);
            al_set_target_bitmap(uVar16);
            al_draw_scaled_bitmap
                      (0,0,local_2c8,local_2f0,0x42a00000,0x42200000,(float)(iVar7 << 4),
                       (float)(iVar8 << 4),ex.zoom,0);
            lVar20 = 0xc;
            do {
              primitive(*(float *)((long)afStack_244 + lVar20) * 16.0 + 80.0,
                        *(float *)((long)afStack_244 + lVar20 + 4) * 16.0 + 40.0,
                        *(float *)((long)afStack_244 + lVar20 + 8) * 16.0 + 80.0,
                        *(float *)((long)local_238 + lVar20) * 16.0 + 40.0,ex.outline,true);
              lVar20 = lVar20 + 0x10;
            } while (lVar20 != 0x10c);
            ex.text_x = 8.0;
            ex.text_y = 592.0;
            print("Thickness: %d (press T to change)",(ulong)(uint)ex.thickness);
            pcVar10 = "hardware";
            if (ex.software != false) {
              pcVar10 = "software";
            }
            print("Drawing with: %s (press S to change)",pcVar10);
            print("Supersampling: %dx (edit ex_draw.ini to change)",(ulong)(uint)ex.samples);
            al_flip_display();
          }
          bVar5 = bVar5 ^ 1;
          do {
            al_wait_for_event(ex.queue,local_280);
            if (local_280[0] == 10) {
              if (local_260 < 0x3b) {
                if (local_260 == 0x13) {
                  ex.software = (_Bool)(ex.software ^ 1);
                }
                else if ((local_260 == 0x14) && (ex.thickness = ex.thickness + 1, ex.thickness == 2)
                        ) {
                  ex.thickness = 0;
                }
              }
              else if (local_260 == 0x4b) {
                ex.what = ex.what + 1;
                if (ex.what == 5) {
                  ex.what = 0;
                }
              }
              else if (local_260 == 0x3b) goto LAB_00102f5e;
            }
            else {
              if (local_280[0] == 0x1e) break;
              if (local_280[0] == 0x2a) {
LAB_00102f5e:
                al_destroy_event_queue(ex.queue);
                return 0;
              }
            }
            bVar1 = bVar5 & 1;
            bVar5 = 0;
          } while (bVar1 == 0);
        } while( true );
      }
      pcVar10 = "data/fixed_font.tga not found.\n";
      ex.font = (ALLEGRO_FONT *)0x0;
      unaff_RBX = local_2a0;
    }
  }
  abort_example(pcVar10);
  pcStack_bc8 = pcVar18;
  pcStack_bb8 = in_RCX;
  lStack_318 = unaff_RBX;
  iVar7 = al_get_font_line_height(ex.font);
  al_store_state(auStack_718,0x10);
  pfStack_be8 = &local_2f0;
  uStack_bf0 = 0x3000000008;
  puStack_be0 = auStack_bd0;
  vsnprintf(acStack_b20,0x400,pcVar10,&uStack_bf0);
  al_set_blender(0,1,3);
  al_draw_textf(ex.text.r,ex.text.b,ex.text_x,ex.text_y,ex.font,0,"%s",acStack_b20);
  iVar8 = al_restore_state(auStack_718);
  ex.text_y = (float)iVar7 + ex.text_y;
  return iVar8;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_CONFIG *config;
   char const *value;
   char str[256];

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   
   al_init_primitives_addon();
   al_install_keyboard();
   al_install_mouse();
   al_init_image_addon();
   al_init_font_addon();
   init_platform_specific();

   /* Read supersampling info from ex_draw.ini. */
   ex.samples = 0;
   config = al_load_config_file("ex_draw.ini");
   if (!config)
      config = al_create_config();
   value = al_get_config_value(config, "settings", "samples");
   if (value)
      ex.samples = strtol(value, NULL, 0);
   sprintf(str, "%d", ex.samples);
   al_set_config_value(config, "settings", "samples", str);
   al_save_config_file("ex_draw.ini", config);
   al_destroy_config(config);

   if (ex.samples) {
      al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 1, ALLEGRO_REQUIRE);
      al_set_new_display_option(ALLEGRO_SAMPLES, ex.samples, ALLEGRO_SUGGEST);
   }
   display = al_create_display(640, 640);
   if (!display) {
      abort_example("Unable to create display.\n");
   }

   init();

   timer = al_create_timer(1.0 / ex.FPS);

   ex.queue = al_create_event_queue();
   al_register_event_source(ex.queue, al_get_keyboard_event_source());
   al_register_event_source(ex.queue, al_get_mouse_event_source());
   al_register_event_source(ex.queue, al_get_display_event_source(display));
   al_register_event_source(ex.queue, al_get_timer_event_source(timer));

   al_start_timer(timer);
   run();

   al_destroy_event_queue(ex.queue);  

   return 0;
}